

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

void __thiscall dmlc::JSONReader::ReadString(JSONReader *this,string *out_str)

{
  char cVar1;
  int iVar2;
  size_t *psVar3;
  ostream *poVar4;
  char *pcVar5;
  int ch;
  LogCheckError _check_err;
  ostringstream output;
  char local_35d;
  int local_35c;
  string local_358;
  string *local_338;
  LogMessageFatal local_330;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  do {
    local_35c = std::istream::get();
    psVar3 = &this->line_count_n_;
    if ((local_35c == 10) || (psVar3 = &this->line_count_r_, local_35c == 0xd)) {
      *psVar3 = *psVar3 + 1;
    }
    iVar2 = isspace(local_35c);
  } while (iVar2 != 0);
  local_330.log_stream_ = (ostringstream)0x22;
  LogCheck_EQ<int,char>((dmlc *)&local_358,&local_35c,(char *)&local_330);
  if (CONCAT71(local_358._M_dataplus._M_p._1_7_,(char)local_358._M_dataplus._M_p) != 0) {
    LogMessageFatal::LogMessageFatal
              (&local_330,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x2ab);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"ch == \'\\\"\'",10);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_330,
                        *(char **)CONCAT71(local_358._M_dataplus._M_p._1_7_,
                                           (char)local_358._M_dataplus._M_p),
                        ((undefined8 *)
                        CONCAT71(local_358._M_dataplus._M_p._1_7_,(char)local_358._M_dataplus._M_p))
                        [1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Error at",8);
    line_info_abi_cxx11_(local_1a8,this);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Expect \'\"\' but get \'",0x16);
    local_35d = (char)local_35c;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_35d,1);
    local_35d = '\'';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_35d,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    LogMessageFatal::~LogMessageFatal(&local_330);
  }
  local_338 = out_str;
  LogCheckError::~LogCheckError((LogCheckError *)&local_358);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  do {
    local_35c = std::istream::get();
    if (local_35c == 0x5c) {
      cVar1 = std::istream::get();
      if (cVar1 < 'n') {
        if (cVar1 == '\"') {
          pcVar5 = "\"";
        }
        else {
          if (cVar1 != '\\') {
LAB_0011587e:
            LogMessageFatal::LogMessageFatal
                      (&local_330,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                       ,0x2c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_330,"unknown string escape \\",0x17);
            local_358._M_dataplus._M_p._0_1_ = cVar1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_330,(char *)&local_358,1);
            LogMessageFatal::~LogMessageFatal(&local_330);
            goto LAB_001157e5;
          }
          pcVar5 = "\\";
        }
      }
      else if (cVar1 == 'n') {
        pcVar5 = "\n";
      }
      else {
        pcVar5 = "\r";
        if (cVar1 != 'r') {
          if (cVar1 != 't') goto LAB_0011587e;
          pcVar5 = "\t";
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,1);
    }
    else {
      if (local_35c == 0x22) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)local_338,(string *)&local_330);
        if ((undefined1 *)CONCAT71(local_330._1_7_,local_330.log_stream_) != &local_330.field_0x10)
        {
          operator_delete((undefined1 *)CONCAT71(local_330._1_7_,local_330.log_stream_),
                          local_330._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        return;
      }
      local_330.log_stream_ = SUB41(local_35c,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_330,1);
    }
LAB_001157e5:
    if ((local_35c + 1U < 0xf) && ((0x4801U >> (local_35c + 1U & 0x1f) & 1) != 0)) {
      LogMessageFatal::LogMessageFatal
                (&local_330,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/json.h"
                 ,0x2d0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"Error at",8);
      line_info_abi_cxx11_(&local_358,this);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_330,
                          (char *)CONCAT71(local_358._M_dataplus._M_p._1_7_,
                                           (char)local_358._M_dataplus._M_p),
                          local_358._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,", Expect \'\"\' but reach end of line ",0x23);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_358._M_dataplus._M_p._1_7_,(char)local_358._M_dataplus._M_p) !=
          &local_358.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_358._M_dataplus._M_p._1_7_,(char)local_358._M_dataplus._M_p),
                        local_358.field_2._M_allocated_capacity + 1);
      }
      LogMessageFatal::~LogMessageFatal(&local_330);
    }
  } while( true );
}

Assistant:

inline void JSONReader::ReadString(std::string *out_str) {
  int ch = NextNonSpace();
  CHECK_EQ(ch, '\"')
      << "Error at" << line_info()
      << ", Expect \'\"\' but get \'" << static_cast<char>(ch) << '\'';
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
  std::ostringstream output;
#else
  std::string output = "";
#endif
  while (true) {
    ch = NextChar();
    if (ch == '\\') {
      char sch = static_cast<char>(NextChar());
      switch (sch) {
      case 'r':
        Extend(&output, "\r");
        break;
      case 'n':
        Extend(&output, "\n");
        break;
      case '\\':
        Extend(&output, "\\");
        break;
      case 't':
        Extend(&output, "\t");
        break;
      case '\"':
        Extend(&output, "\"");
        break;
      default:
        LOG(FATAL) << "unknown string escape \\" << sch;
      }
    } else {
      if (ch == '\"')
        break;
      Extend(&output, static_cast<char>(ch));
    }
    if (ch == EOF || ch == '\r' || ch == '\n') {
      LOG(FATAL)
          << "Error at" << line_info()
          << ", Expect \'\"\' but reach end of line ";
    }
  }
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
  *out_str = output.str();
#else
  *out_str = output;
#endif
}